

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall
rlottie::internal::renderer::CompLayer::renderMatteLayer
          (CompLayer *this,VPainter *painter,VRle *mask,VRle *matteRle,Layer *layer,Layer *src,
          SurfaceCache *cache)

{
  MatteType MVar1;
  int iVar2;
  VPainter *this_00;
  VRect *source;
  undefined4 extraout_var;
  index_type iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  Layer *in_R8;
  long *in_R9;
  VDrawable *in_stack_00000008;
  VRect clip;
  VBitmap layerBitmap;
  VPainter layerPainter;
  VBitmap srcBitmap;
  VPainter srcPainter;
  VSize size;
  VDrawable *this_01;
  VPainter *in_stack_fffffffffffffcd0;
  VRect *in_stack_fffffffffffffcd8;
  VPainter *pVVar4;
  Format format;
  VSize *this_02;
  size_t in_stack_fffffffffffffcf0;
  VDrawable *width;
  uint8_t const_alpha;
  SurfaceCache *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 uVar5;
  VRect *target;
  VSpan<VDrawable_*> local_2b8;
  VRect local_2a8;
  undefined1 local_298 [304];
  VPainter local_168;
  VRect local_48;
  VSize local_38;
  long *local_30;
  Layer *local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_48 = VPainter::clipBoundingRect((VPainter *)0x16054c);
  local_38 = VRect::size(in_stack_fffffffffffffcd8);
  pVVar4 = &local_168;
  VPainter::VPainter(in_stack_fffffffffffffcd0);
  this_02 = &local_38;
  this_01 = in_stack_00000008;
  iVar2 = VSize::width(this_02);
  this_00 = (VPainter *)(long)iVar2;
  VSize::height(this_02);
  uVar5 = 3;
  SurfaceCache::make_surface
            (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,(size_t)this_02,
             (Format)((ulong)pVVar4 >> 0x38));
  VPainter::begin(this_00,(VBitmap *)this_01);
  (**(code **)(*local_30 + 0x20))(local_30,pVVar4,local_18,local_20,in_stack_00000008);
  VPainter::end(pVVar4);
  format = (Format)((ulong)pVVar4 >> 0x38);
  pVVar4 = (VPainter *)(local_298 + 8);
  VPainter::VPainter(this_00);
  width = in_stack_00000008;
  iVar2 = VSize::width(this_02);
  source = (VRect *)(long)iVar2;
  VSize::height(this_02);
  target = (VRect *)local_298;
  SurfaceCache::make_surface((SurfaceCache *)source,(size_t)width,(size_t)this_02,format);
  const_alpha = (uint8_t)((ulong)width >> 0x38);
  VPainter::begin(this_00,(VBitmap *)this_01);
  (*local_28->_vptr_Layer[4])(local_28,pVVar4,local_18,local_20,in_stack_00000008);
  MVar1 = Layer::matteType(local_28);
  switch(MVar1) {
  case Alpha:
  case Luma:
    VPainter::setBlendMode((VPainter *)(local_298 + 8),DestIn);
    break;
  case AlphaInv:
  case LumaInv:
    VPainter::setBlendMode((VPainter *)(local_298 + 8),DestOut);
  }
  MVar1 = Layer::matteType(local_28);
  if ((MVar1 == Luma) || (MVar1 = Layer::matteType(local_28), MVar1 == LumaInv)) {
    VBitmap::updateLuma((VBitmap *)this_00);
  }
  local_2a8 = VPainter::clipBoundingRect((VPainter *)0x160753);
  iVar2 = (*local_28->_vptr_Layer[3])();
  local_2b8._data = (pointer)CONCAT44(extraout_var,iVar2);
  iVar3 = VSpan<VDrawable_*>::size(&local_2b8);
  if (iVar3 == 1) {
    (*local_28->_vptr_Layer[3])();
    VSpan<VDrawable_*>::operator[]((VSpan<VDrawable_*> *)this_00,(index_type)this_01);
    VDrawable::rle(this_01);
    local_2a8 = VRle::boundingRect((VRle *)0x1607d1);
    VRle::~VRle((VRle *)0x1607ff);
  }
  VPainter::drawBitmap
            (pVVar4,target,(VBitmap *)CONCAT44(uVar5,in_stack_fffffffffffffd00),source,const_alpha);
  VPainter::end((VPainter *)(local_298 + 8));
  VPainter::drawBitmap
            (pVVar4,target,(VBitmap *)CONCAT44(uVar5,in_stack_fffffffffffffd00),source,const_alpha);
  SurfaceCache::release_surface((SurfaceCache *)this_00,(VBitmap *)this_01);
  SurfaceCache::release_surface((SurfaceCache *)this_00,(VBitmap *)this_01);
  VBitmap::~VBitmap((VBitmap *)0x16088f);
  VPainter::~VPainter((VPainter *)0x16089c);
  VBitmap::~VBitmap((VBitmap *)0x1608a9);
  VPainter::~VPainter((VPainter *)0x1608b6);
  return;
}

Assistant:

void renderer::CompLayer::renderMatteLayer(VPainter *painter, const VRle &mask,
                                           const VRle &     matteRle,
                                           renderer::Layer *layer,
                                           renderer::Layer *src,
                                           SurfaceCache &   cache)
{
    VSize size = painter->clipBoundingRect().size();
    // Decide if we can use fast matte.
    // 1. draw src layer to matte buffer
    VPainter srcPainter;
    VBitmap  srcBitmap = cache.make_surface(size.width(), size.height());
    srcPainter.begin(&srcBitmap);
    src->render(&srcPainter, mask, matteRle, cache);
    srcPainter.end();

    // 2. draw layer to layer buffer
    VPainter layerPainter;
    VBitmap  layerBitmap = cache.make_surface(size.width(), size.height());
    layerPainter.begin(&layerBitmap);
    layer->render(&layerPainter, mask, matteRle, cache);

    // 2.1update composition mode
    switch (layer->matteType()) {
    case model::MatteType::Alpha:
    case model::MatteType::Luma: {
        layerPainter.setBlendMode(BlendMode::DestIn);
        break;
    }
    case model::MatteType::AlphaInv:
    case model::MatteType::LumaInv: {
        layerPainter.setBlendMode(BlendMode::DestOut);
        break;
    }
    default:
        break;
    }

    // 2.2 update srcBuffer if the matte is luma type
    if (layer->matteType() == model::MatteType::Luma ||
        layer->matteType() == model::MatteType::LumaInv) {
        srcBitmap.updateLuma();
    }

    auto clip = layerPainter.clipBoundingRect();

    // if the layer has only one renderer then use it as the clip rect
    // when blending 2 buffer and copy back to final buffer to avoid
    // unnecessary pixel processing.
    if (layer->renderList().size() == 1)
    {
        clip = layer->renderList()[0]->rle().boundingRect();
    }

    // 2.3 draw src buffer as mask
    layerPainter.drawBitmap(clip, srcBitmap, clip);
    layerPainter.end();
    // 3. draw the result buffer into painter
    painter->drawBitmap(clip, layerBitmap, clip);

    cache.release_surface(srcBitmap);
    cache.release_surface(layerBitmap);
}